

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborValue * QCborValue::fromCbor(QByteArray *ba,QCborParserError *error)

{
  QCborError QVar1;
  qint64 qVar2;
  qint64 *in_RDX;
  QCborStreamReader *in_RDI;
  long in_FS_OFFSET;
  QCborValue *result;
  QCborStreamReader reader;
  QCborStreamReader *in_stack_ffffffffffffff70;
  QCborStreamReader *this;
  QCborStreamReader *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QCborStreamReader::QCborStreamReader(in_stack_ffffffffffffffa0,&local_28);
  *(undefined1 **)&in_RDI->type_ = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->value64 = (quint64)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d)._M_t.
  super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>.
  _M_t.
  super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
  .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl =
       (QCborStreamReaderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  fromCbor((QCborStreamReader *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (in_RDX != (qint64 *)0x0) {
    QVar1 = QCborStreamReader::lastError(in_stack_ffffffffffffff70);
    *(Code *)(in_RDX + 1) = QVar1.c;
    qVar2 = QCborStreamReader::currentOffset(this);
    *in_RDX = qVar2;
  }
  QCborStreamReader::~QCborStreamReader((QCborStreamReader *)0x471616);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QCborValue *)this;
}

Assistant:

QCborValue QCborValue::fromCbor(const QByteArray &ba, QCborParserError *error)
{
    QCborStreamReader reader(ba);
    QCborValue result = fromCbor(reader);
    if (error) {
        error->error = reader.lastError();
        error->offset = reader.currentOffset();
    }
    return result;
}